

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_16UL>::reserve
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_16UL> *this,
          size_t minSize)

{
  unsigned_long uVar1;
  pool_ref<soul::AST::VariableDeclaration> *ppVar2;
  ulong local_28;
  size_t i;
  pool_ref<soul::AST::VariableDeclaration> *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_16UL> *this_local;
  
  if (this->numAllocated < minSize) {
    uVar1 = getAlignedSize<16,unsigned_long>(minSize);
    if (0x10 < uVar1) {
      ppVar2 = (pool_ref<soul::AST::VariableDeclaration> *)operator_new__(uVar1 << 3);
      for (local_28 = 0; local_28 < this->numActive; local_28 = local_28 + 1) {
        ppVar2[local_28].object = this->items[local_28].object;
        pool_ref<soul::AST::VariableDeclaration>::~pool_ref(this->items + local_28);
      }
      freeIfHeapAllocated(this);
      this->items = ppVar2;
    }
    this->numAllocated = uVar1;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }